

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker_manager.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::tracker_manager::tracker_manager
          (tracker_manager *this,send_fun_t *send_fun,send_fun_hostname_t *send_fun_hostname,
          counters *stats_counters,resolver_interface *resolver,session_settings *sett,
          session_logger *ses)

{
  undefined8 uVar1;
  
  (this->m_udp_conns)._M_h._M_buckets = &(this->m_udp_conns)._M_h._M_single_bucket;
  (this->m_udp_conns)._M_h._M_bucket_count = 1;
  (this->m_udp_conns)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_udp_conns)._M_h._M_element_count = 0;
  (this->m_udp_conns)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_udp_conns)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_udp_conns)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_http_conns).
  super__Vector_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_http_conns).
  super__Vector_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_http_conns).
  super__Vector_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_queued).
  super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->m_queued).
  super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->m_queued).
  super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->m_queued).
  super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->m_queued).
  super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->m_queued).
  super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->m_queued).
  super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->m_queued).
  super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->m_queued).
  super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->m_queued).
  super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  ::std::
  _Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
  ::_M_initialize_map(&(this->m_queued).
                       super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
                      ,0);
  *(undefined8 *)&(this->m_send_fun).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_send_fun).super__Function_base._M_functor + 8) = 0;
  (this->m_send_fun).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_send_fun)._M_invoker = send_fun->_M_invoker;
  if ((send_fun->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar1 = *(undefined8 *)((long)&(send_fun->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->m_send_fun).super__Function_base._M_functor =
         *(undefined8 *)&(send_fun->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->m_send_fun).super__Function_base._M_functor + 8) = uVar1;
    (this->m_send_fun).super__Function_base._M_manager = (send_fun->super__Function_base)._M_manager
    ;
    (send_fun->super__Function_base)._M_manager = (_Manager_type)0x0;
    send_fun->_M_invoker = (_Invoker_type)0x0;
  }
  *(undefined8 *)&(this->m_send_fun_hostname).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_send_fun_hostname).super__Function_base._M_functor + 8) = 0;
  (this->m_send_fun_hostname).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_send_fun_hostname)._M_invoker = send_fun_hostname->_M_invoker;
  if ((send_fun_hostname->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar1 = *(undefined8 *)((long)&(send_fun_hostname->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->m_send_fun_hostname).super__Function_base._M_functor =
         *(undefined8 *)&(send_fun_hostname->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->m_send_fun_hostname).super__Function_base._M_functor + 8) = uVar1;
    (this->m_send_fun_hostname).super__Function_base._M_manager =
         (send_fun_hostname->super__Function_base)._M_manager;
    (send_fun_hostname->super__Function_base)._M_manager = (_Manager_type)0x0;
    send_fun_hostname->_M_invoker = (_Invoker_type)0x0;
  }
  this->m_host_resolver = resolver;
  this->m_settings = sett;
  this->m_stats_counters = stats_counters;
  this->m_abort = false;
  this->m_ses = ses;
  return;
}

Assistant:

tracker_manager::tracker_manager(send_fun_t send_fun
		, send_fun_hostname_t send_fun_hostname
		, counters& stats_counters
		, aux::resolver_interface& resolver
		, aux::session_settings const& sett
#if !defined TORRENT_DISABLE_LOGGING || TORRENT_USE_ASSERTS
		, aux::session_logger& ses
#endif
		)
		: m_send_fun(std::move(send_fun))
		, m_send_fun_hostname(std::move(send_fun_hostname))
		, m_host_resolver(resolver)
		, m_settings(sett)
		, m_stats_counters(stats_counters)
#if !defined TORRENT_DISABLE_LOGGING || TORRENT_USE_ASSERTS
		, m_ses(ses)
#endif
	{}